

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifSat.c
# Opt level: O2

word If_ManSat6ComposeLut4(int t,word *f,int k)

{
  word wVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (k < 5) {
    uVar2 = 0;
    uVar3 = (ulong)(uint)k;
    if (k < 1) {
      uVar3 = 0;
    }
    wVar1 = 0;
    for (; uVar2 != 1 << ((byte)k & 0x1f); uVar2 = uVar2 + 1) {
      if (((uint)t >> (uVar2 & 0x1f) & 1) != 0) {
        uVar4 = 0xffffffffffffffff;
        for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
          uVar4 = uVar4 & ((ulong)((uVar2 >> ((uint)uVar5 & 0x1f) & 1) != 0) - 1 ^ f[uVar5]);
        }
        wVar1 = wVar1 | uVar4;
      }
    }
    return wVar1;
  }
  __assert_fail("k <= 4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifSat.c"
                ,0x6b,"word If_ManSat6ComposeLut4(int, word *, int)");
}

Assistant:

static word If_ManSat6ComposeLut4( int t, word f[4], int k )
{
    int m, v, nMints = (1 << k);
    word c, r = 0;
    assert( k <= 4 );
    for ( m = 0; m < nMints; m++ )
    {
        if ( !((t >> m) & 1) )
            continue;
        c = ~(word)0;
        for ( v = 0; v < k; v++ )
            c &= ((m >> v) & 1) ? f[v] : ~f[v];
        r |= c;
    }
    return r;
}